

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis.cpp
# Opt level: O2

QpSolverStatus __thiscall
Basis::activate(Basis *this,Settings *settings,HighsInt conid,BasisStatus newstatus,
               HighsInt nonactivetoremove,Pricing *pricing)

{
  int iVar1;
  pointer piVar2;
  bool bVar3;
  QpSolverStatus QVar4;
  mapped_type *pmVar5;
  HighsInt nonactivetoremove_local;
  HighsInt conid_local;
  Settings *local_48;
  Pricing *local_40;
  HighsInt local_34;
  
  nonactivetoremove_local = nonactivetoremove;
  conid_local = conid;
  local_34 = conid;
  bVar3 = contains<int>(&this->active_constraint_index,&local_34);
  if (bVar3) {
    printf("Degeneracy? constraint %d already in basis\n",(ulong)(uint)conid);
    QVar4 = DEGENERATE;
  }
  else {
    local_40 = pricing;
    pmVar5 = std::
             map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
             ::operator[](&this->basisstatus,&nonactivetoremove_local);
    *pmVar5 = kInactive;
    local_48 = settings;
    pmVar5 = std::
             map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
             ::operator[](&this->basisstatus,&conid_local);
    *pmVar5 = newstatus;
    std::vector<int,_std::allocator<int>_>::push_back(&this->active_constraint_index,&conid_local);
    iVar1 = (this->constraintindexinbasisfactor).super__Vector_base<int,_std::allocator<int>_>.
            _M_impl.super__Vector_impl_data._M_start[nonactivetoremove_local];
    (this->baseindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[iVar1] = conid_local;
    remove<int>(&this->non_active_constraint_index,&nonactivetoremove_local);
    updatebasis(this,local_48,conid_local,nonactivetoremove_local,local_40);
    QVar4 = OK;
    if (this->updatessinceinvert != 0) {
      piVar2 = (this->constraintindexinbasisfactor).super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      piVar2[nonactivetoremove_local] = -1;
      piVar2[conid_local] = iVar1;
    }
  }
  return QVar4;
}

Assistant:

QpSolverStatus Basis::activate(const Settings& settings, HighsInt conid,
                               BasisStatus newstatus,
                               HighsInt nonactivetoremove, Pricing* pricing) {
  // printf("activ %" HIGHSINT_FORMAT "\n", conid);
  if (!contains(active_constraint_index, (HighsInt)conid)) {
    basisstatus[nonactivetoremove] = BasisStatus::kInactive;
    basisstatus[conid] = newstatus;
    active_constraint_index.push_back(conid);
  } else {
    printf("Degeneracy? constraint %" HIGHSINT_FORMAT " already in basis\n",
           conid);
    return QpSolverStatus::DEGENERATE;
  }

  // printf("drop %d\n", nonactivetoremove);
  // remove non-active row from basis
  HighsInt rowtoremove = constraintindexinbasisfactor[nonactivetoremove];

  baseindex[rowtoremove] = conid;
  remove(non_active_constraint_index, nonactivetoremove);
  updatebasis(settings, conid, nonactivetoremove, pricing);

  if (updatessinceinvert != 0) {
    constraintindexinbasisfactor[nonactivetoremove] = -1;
    constraintindexinbasisfactor[conid] = rowtoremove;
  }
  return QpSolverStatus::OK;
}